

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

bool __thiscall ot::commissioner::coap::Message::IsTokenEqual(Message *this,Message *aMessage)

{
  bool bVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  GetToken((ByteArray *)&local_20,this);
  GetToken((ByteArray *)&_Stack_38,aMessage);
  bVar1 = std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20);
  return bVar1;
}

Assistant:

bool Message::IsTokenEqual(const Message &aMessage) const
{
    return GetToken() == aMessage.GetToken();
}